

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ObjPrintVerbose(Aig_Obj_t *pObj,int fHaig)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x28f,"void Aig_ObjPrintVerbose(Aig_Obj_t *, int)");
  }
  printf("Node %d : ",(ulong)(uint)pObj->Id);
  iVar1 = Aig_ObjIsConst1(pObj);
  if (iVar1 == 0) {
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
    if (uVar2 == 3) {
      printf("CO( ");
      pcVar3 = "\'";
      if (((ulong)pObj->pFanin0 & 1) == 0) {
        pcVar3 = " ";
      }
      printf("%d%s )",(ulong)*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24),pcVar3);
      goto LAB_0058976f;
    }
    if (uVar2 != 2) {
      pcVar4 = "\'";
      pcVar3 = "\'";
      if (((ulong)pObj->pFanin0 & 1) == 0) {
        pcVar3 = " ";
      }
      if (((ulong)pObj->pFanin1 & 1) == 0) {
        pcVar4 = " ";
      }
      printf("AND( %d%s, %d%s )",
             (ulong)*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24),pcVar3,
             (ulong)*(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24),pcVar4);
      goto LAB_0058976f;
    }
    pcVar3 = "CI";
  }
  else {
    pcVar3 = "constant 1";
  }
  printf(pcVar3);
LAB_0058976f:
  printf(" (refs = %3d)",(ulong)(*(uint *)&pObj->field_0x18 >> 6));
  return;
}

Assistant:

void Aig_ObjPrintVerbose( Aig_Obj_t * pObj, int fHaig )
{
    assert( !Aig_IsComplement(pObj) );
    printf( "Node %d : ", pObj->Id );
    if ( Aig_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Aig_ObjIsCi(pObj) )
        printf( "CI" );
    else if ( Aig_ObjIsCo(pObj) )
    {
        printf( "CO( " );
        printf( "%d%s )", 
            Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " ") );
    }
    else
        printf( "AND( %d%s, %d%s )", 
            Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " "), 
            Aig_ObjFanin1(pObj)->Id, (Aig_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Aig_ObjRefs(pObj) );
}